

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O0

Harris * __thiscall Harris::GaussFilter(Harris *this,Mat *img,int range)

{
  float *pfVar1;
  float in_ECX;
  undefined4 in_register_00000014;
  Mat *this_00;
  double dVar2;
  double dVar3;
  int local_c0;
  float m_1;
  int x_1;
  float res_1;
  int c_1;
  int r_1;
  int local_98;
  float m;
  int x;
  float res;
  int c;
  int r;
  Mat gaussHelperV;
  int range_local;
  Mat *img_local;
  Harris *this_local;
  Mat *gauss;
  
  this_00 = (Mat *)CONCAT44(in_register_00000014,range);
  cv::Mat::Mat((Mat *)&c,*(int *)(this_00 + 8) + (int)in_ECX * -2,
               *(int *)(this_00 + 0xc) + (int)in_ECX * -2,5);
  for (res = in_ECX; x = (int)in_ECX, (int)res < *(int *)(this_00 + 8) - (int)in_ECX;
      res = (float)((int)res + 1)) {
    for (; x < *(int *)(this_00 + 0xc) - (int)in_ECX; x = x + 1) {
      m = 0.0;
      for (local_98 = -(int)in_ECX; local_98 <= (int)in_ECX; local_98 = local_98 + 1) {
        dVar2 = sqrt(6.283185307179586);
        dVar3 = exp((double)local_98 * -0.5 * (double)local_98);
        pfVar1 = cv::Mat::at<float>(this_00,(int)res - (int)in_ECX,x - (int)in_ECX);
        m = (float)((1.0 / dVar2) * dVar3) * *pfVar1 + m;
      }
      pfVar1 = cv::Mat::at<float>((Mat *)&c,(int)res - (int)in_ECX,x - (int)in_ECX);
      *pfVar1 = m;
    }
  }
  cv::Mat::Mat(&this->harrisResponses,*(int *)(this_00 + 8) + (int)in_ECX * -2,
               *(int *)(this_00 + 0xc) + (int)in_ECX * -2,5);
  for (res_1 = in_ECX; x_1 = (int)in_ECX, (int)res_1 < *(int *)(this_00 + 8) - (int)in_ECX;
      res_1 = (float)((int)res_1 + 1)) {
    for (; x_1 < *(int *)(this_00 + 0xc) - (int)in_ECX; x_1 = x_1 + 1) {
      m_1 = 0.0;
      for (local_c0 = -(int)in_ECX; local_c0 <= (int)in_ECX; local_c0 = local_c0 + 1) {
        dVar2 = sqrt(6.283185307179586);
        dVar3 = exp((double)local_c0 * -0.5 * (double)local_c0);
        pfVar1 = cv::Mat::at<float>((Mat *)&c,(int)res_1 - (int)in_ECX,x_1 - (int)in_ECX);
        m_1 = (float)((1.0 / dVar2) * dVar3) * *pfVar1 + m_1;
      }
      pfVar1 = cv::Mat::at<float>(&this->harrisResponses,(int)res_1 - (int)in_ECX,x_1 - (int)in_ECX)
      ;
      *pfVar1 = m_1;
    }
  }
  cv::Mat::~Mat((Mat *)&c);
  return this;
}

Assistant:

Mat Harris::GaussFilter(Mat& img, int range) {
    // Helper Mats for better time complexity
    Mat gaussHelperV(img.rows-range*2, img.cols-range*2, CV_32F);
    for(int r=range; r<img.rows-range; r++) {
        for(int c=range; c<img.cols-range; c++) {
            float res = 0;

            for(int x = -range; x<=range; x++) {
                float m = 1/sqrt(2*M_PI)*exp(-0.5*x*x);

                res += m * img.at<float>(r-range,c-range);
            }

            gaussHelperV.at<float>(r-range,c-range) = res;
        }
    }

    Mat gauss(img.rows-range*2, img.cols-range*2, CV_32F);
    for(int r=range; r<img.rows-range; r++) {
        for(int c=range; c<img.cols-range; c++) {
            float res = 0;

            for(int x = -range; x<=range; x++) {
                float m = 1/sqrt(2*M_PI)*exp(-0.5*x*x);

                res += m * gaussHelperV.at<float>(r-range,c-range);
            }

            gauss.at<float>(r-range,c-range) = res;
        }
    }

    return gauss;
}